

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

string * __thiscall
cmUuid::FromMd5(string *__return_storage_ptr__,cmUuid *this,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  cmsysMD5 *md5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  uchar digest [16];
  
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateHashInput((cmUuid *)__return_storage_ptr__,uuidNamespace,name,&hashInput);
  md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5,hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                  (int)hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                  (int)hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
  digest[0] = '\0';
  digest[1] = '\0';
  digest[2] = '\0';
  digest[3] = '\0';
  digest[4] = '\0';
  digest[5] = '\0';
  digest[6] = '\0';
  digest[7] = '\0';
  digest[8] = '\0';
  digest[9] = '\0';
  digest[10] = '\0';
  digest[0xb] = '\0';
  digest[0xc] = '\0';
  digest[0xd] = '\0';
  digest[0xe] = '\0';
  digest[0xf] = '\0';
  cmsysMD5_Finalize(md5,digest);
  cmsysMD5_Delete(md5);
  FromDigest_abi_cxx11_(__return_storage_ptr__,this,digest,'\x03');
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromMd5(std::vector<unsigned char> const& uuidNamespace,
  std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  cmsysMD5_s *md5 = cmsysMD5_New();
  cmsysMD5_Initialize(md5);
  cmsysMD5_Append(md5, &hashInput[0], int(hashInput.size()));

  unsigned char digest[16] = {0};
  cmsysMD5_Finalize(md5, digest);

  cmsysMD5_Delete(md5);

  return this->FromDigest(digest, 3);
}